

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qht.c
# Opt level: O0

void qht_map_iter__all_locked(uc_struct_conflict5 *uc,qht_map *map,qht_iter *iter,void *userp)

{
  ulong local_30;
  size_t i;
  void *userp_local;
  qht_iter *iter_local;
  qht_map *map_local;
  uc_struct_conflict5 *uc_local;
  
  for (local_30 = 0; local_30 < map->n_buckets; local_30 = local_30 + 1) {
    qht_bucket_iter(uc,map->buckets + local_30,iter,userp);
  }
  return;
}

Assistant:

static inline void qht_map_iter__all_locked(struct uc_struct *uc, struct qht_map *map,
                                            const struct qht_iter *iter,
                                            void *userp)
{
    size_t i;

    for (i = 0; i < map->n_buckets; i++) {
        qht_bucket_iter(uc, &map->buckets[i], iter, userp);
    }
}